

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

int fe_spch_to_frame(fe_t *fe,int len)

{
  float fVar1;
  short sVar2;
  short *psVar3;
  frame_t *pfVar4;
  window_t *pwVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  fVar1 = (float)fe->pre_emphasis_alpha;
  psVar3 = fe->spch;
  pfVar4 = fe->frame;
  lVar6 = (long)len;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    *pfVar4 = (frame_t)((double)(int)*psVar3 - (double)(int)fe->pre_emphasis_prior * (double)fVar1);
    if (1 < len) {
      uVar10 = 1;
      do {
        pfVar4[uVar10] =
             (frame_t)((double)(int)psVar3[uVar10] - (double)(int)psVar3[uVar10 - 1] * (double)fVar1
                      );
        uVar10 = uVar10 + 1;
      } while ((uint)len != uVar10);
    }
    lVar8 = (long)fe->frame_shift;
    if (len < fe->frame_shift) {
      lVar8 = lVar6;
    }
    fe->pre_emphasis_prior = psVar3[lVar8 + -1];
  }
  else if (0 < len) {
    uVar10 = 0;
    do {
      pfVar4[uVar10] = (frame_t)(double)(int)psVar3[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uint)len != uVar10);
  }
  memset(fe->frame + lVar6,0,(fe->fft_size - lVar6) * 8);
  pwVar5 = fe->hamming_window;
  pfVar4 = fe->frame;
  sVar2 = fe->frame_size;
  uVar7 = (uint)sVar2;
  uVar10 = (ulong)uVar7;
  if (fe->remove_dc != '\0') {
    dVar12 = 0.0;
    if (0 < sVar2) {
      uVar11 = 0;
      do {
        dVar12 = dVar12 + (double)pfVar4[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (0 < sVar2) {
      uVar11 = 0;
      do {
        pfVar4[uVar11] = (frame_t)((double)pfVar4[uVar11] - dVar12 / (double)(int)uVar7);
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  if (1 < sVar2) {
    pdVar9 = (double *)(pfVar4 + uVar10);
    uVar10 = 0;
    do {
      pdVar9 = pdVar9 + -1;
      pfVar4[uVar10] = (frame_t)((double)pfVar4[uVar10] * (double)pwVar5[uVar10]);
      *pdVar9 = *pdVar9 * (double)pwVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar7 >> 1 != uVar10);
  }
  return len;
}

Assistant:

static int
fe_spch_to_frame(fe_t * fe, int len)
{
    /* Copy to the frame buffer. */
    if (fe->pre_emphasis_alpha != 0.0) {
        fe_pre_emphasis_int16(fe->spch, fe->frame, len,
                              fe->pre_emphasis_alpha,
                              fe->pre_emphasis_prior);
        if (len >= fe->frame_shift)
            fe->pre_emphasis_prior = fe->spch[fe->frame_shift - 1];
        else
            fe->pre_emphasis_prior = fe->spch[len - 1];
    }
    else
        fe_copy_to_frame_int16(fe->spch, fe->frame, len);

    /* Zero pad up to FFT size. */
    memset(fe->frame + len, 0, (fe->fft_size - len) * sizeof(*fe->frame));

    /* Window. */
    fe_hamming_window(fe->frame, fe->hamming_window, fe->frame_size,
                      fe->remove_dc);

    return len;
}